

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O2

Qiniu_Error
Qiniu_For_Each_Header
          (Qiniu_Header *header,_func_Qiniu_Error_Qiniu_Header_ptr_void_ptr *for_each,void *data)

{
  ulong uVar1;
  char *pcVar2;
  Qiniu_Header *cur_header;
  Qiniu_Error QVar3;
  Qiniu_Error QVar4;
  
  pcVar2 = (char *)data;
  for (; header != (Qiniu_Header *)0x0; header = header->next) {
    QVar3 = (*for_each)(header,data);
    pcVar2 = QVar3.message;
    if (QVar3.code != 200) goto LAB_0011d05f;
  }
  QVar3.message = pcVar2;
  QVar3._0_8_ = 200;
LAB_0011d05f:
  QVar4.message = QVar3.message;
  uVar1 = QVar3._0_8_;
  if (header == (Qiniu_Header *)0x0) {
    uVar1 = (ulong)(uint)Qiniu_OK.code;
  }
  QVar4._0_8_ = uVar1;
  return QVar4;
}

Assistant:

static Qiniu_Error Qiniu_For_Each_Header(Qiniu_Header *header, Qiniu_Error (*for_each)(Qiniu_Header *header, void *data), void *data)
{
	for (Qiniu_Header *cur_header = header; cur_header != NULL; cur_header = cur_header->next)
	{
		Qiniu_Error err = for_each(cur_header, data);
		if (err.code != 200)
		{
			return err;
		}
	}
	return Qiniu_OK;
}